

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O1

void mean_double_suite::test_alternating(void)

{
  close_to<double> predicate;
  close_to<double> predicate_00;
  close_to<double> predicate_01;
  close_to<double> predicate_02;
  close_to<double> predicate_03;
  close_to<double> predicate_04;
  close_to<double> predicate_05;
  close_to<double> predicate_06;
  close_to<double> predicate_07;
  close_to<double> predicate_08;
  close_to<double> predicate_09;
  close_to<double> predicate_10;
  close_to<double> predicate_11;
  close_to<double> predicate_12;
  close_to<double> predicate_13;
  close_to<double> predicate_14;
  close_to<double> predicate_15;
  close_to<double> predicate_16;
  close_to<double> predicate_17;
  close_to<double> predicate_18;
  close_to<double> predicate_19;
  close_to<double> predicate_20;
  close_to<double> predicate_21;
  close_to<double> predicate_22;
  close_to<double> predicate_23;
  close_to<double> predicate_24;
  double *in_stack_ffffffffffffffb8;
  double local_40;
  char local_38 [8];
  
  local_38[0] = '\0';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = -0x10;
  local_38[7] = '?';
  local_40 = 1.0;
  predicate.absolute = 2.2250738585072014e-308;
  predicate.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x3c,0x10e1e1,local_38,&local_40,in_stack_ffffffffffffffb8,predicate);
  local_38[0] = -0x77;
  local_38[1] = -0x78;
  local_38[2] = -0x78;
  local_38[3] = -0x78;
  local_38[4] = -0x78;
  local_38[5] = -0x78;
  local_38[6] = -8;
  local_38[7] = '?';
  local_40 = 1.53333;
  predicate_00.absolute = 2.2250738585072014e-308;
  predicate_00.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.53333","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x3e,0x10e1e1,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_00);
  local_38[0] = -0x40;
  local_38[1] = '\x19';
  local_38[2] = -0x29;
  local_38[3] = '\"';
  local_38[4] = 'A';
  local_38[5] = 'M';
  local_38[6] = -0xb;
  local_38[7] = '?';
  local_40 = 1.33136;
  predicate_01.absolute = 2.2250738585072014e-308;
  predicate_01.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.33136","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x40,0x10e1e1,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_01);
  local_38[0] = -0x77;
  local_38[1] = -0x78;
  local_38[2] = -0x78;
  local_38[3] = -0x78;
  local_38[4] = -0x78;
  local_38[5] = -0x78;
  local_38[6] = -8;
  local_38[7] = '?';
  local_40 = 1.53333;
  predicate_02.absolute = 2.2250738585072014e-308;
  predicate_02.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.53333","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x42,0x10e1e1,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_02);
  local_38[0] = 'X';
  local_38[1] = -0x77;
  local_38[2] = 'U';
  local_38[3] = '#';
  local_38[4] = -0x13;
  local_38[5] = 'W';
  local_38[6] = -10;
  local_38[7] = '?';
  local_40 = 1.39647;
  predicate_03.absolute = 2.2250738585072014e-308;
  predicate_03.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.39647","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x44,0x10e1e1,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_03);
  local_38[0] = -0x77;
  local_38[1] = -0x78;
  local_38[2] = -0x78;
  local_38[3] = -0x78;
  local_38[4] = -0x78;
  local_38[5] = -0x78;
  local_38[6] = -8;
  local_38[7] = '?';
  local_40 = 1.53333;
  predicate_04.absolute = 2.2250738585072014e-308;
  predicate_04.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.53333","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x46,0x10e1e1,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_04);
  local_38[0] = -0x65;
  local_38[1] = -0x55;
  local_38[2] = 's';
  local_38[3] = 'X';
  local_38[4] = -0x1b;
  local_38[5] = -0x3a;
  local_38[6] = -10;
  local_38[7] = '?';
  local_40 = 1.42356;
  predicate_05.absolute = 2.2250738585072014e-308;
  predicate_05.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.42356","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x48,0x10e1e1,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_05);
  local_38[0] = -0x77;
  local_38[1] = -0x78;
  local_38[2] = -0x78;
  local_38[3] = -0x78;
  local_38[4] = -0x78;
  local_38[5] = -0x78;
  local_38[6] = -8;
  local_38[7] = '?';
  local_40 = 1.53333;
  predicate_06.absolute = 2.2250738585072014e-308;
  predicate_06.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.53333","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x4a,0x10e1e1,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_06);
  local_38[0] = -0x2c;
  local_38[1] = -0x48;
  local_38[2] = 'M';
  local_38[3] = '8';
  local_38[4] = '\x12';
  local_38[5] = '\x02';
  local_38[6] = -9;
  local_38[7] = '?';
  local_40 = 1.43801;
  predicate_07.absolute = 2.2250738585072014e-308;
  predicate_07.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.43801","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x4c,0x10e1e1,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_07);
  local_38[0] = -0x77;
  local_38[1] = -0x78;
  local_38[2] = -0x78;
  local_38[3] = -0x78;
  local_38[4] = -0x78;
  local_38[5] = -0x78;
  local_38[6] = -8;
  local_38[7] = '?';
  local_40 = 1.53333;
  predicate_08.absolute = 2.2250738585072014e-308;
  predicate_08.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.53333","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x4e,0x10e1e1,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_08);
  local_38[0] = -0x68;
  local_38[1] = 'F';
  local_38[2] = '*';
  local_38[3] = '1';
  local_38[4] = -0x30;
  local_38[5] = '%';
  local_38[6] = -9;
  local_38[7] = '?';
  local_40 = 1.44673;
  predicate_09.absolute = 2.2250738585072014e-308;
  predicate_09.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.44673","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x50,0x10e1e1,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_09);
  local_38[0] = -0x77;
  local_38[1] = -0x78;
  local_38[2] = -0x78;
  local_38[3] = -0x78;
  local_38[4] = -0x78;
  local_38[5] = -0x78;
  local_38[6] = -8;
  local_38[7] = '?';
  local_40 = 1.53333;
  predicate_10.absolute = 2.2250738585072014e-308;
  predicate_10.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.53333","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x52,0x10e1e1,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_10);
  local_38[0] = '\b';
  local_38[1] = '\\';
  local_38[2] = -0x20;
  local_38[3] = -0x71;
  local_38[4] = '\v';
  local_38[5] = '=';
  local_38[6] = -9;
  local_38[7] = '?';
  local_40 = 1.4524;
  predicate_11.absolute = 2.2250738585072014e-308;
  predicate_11.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.4524","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x54,0x10e1e1,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_11);
  local_38[0] = -0x77;
  local_38[1] = -0x78;
  local_38[2] = -0x78;
  local_38[3] = -0x78;
  local_38[4] = -0x78;
  local_38[5] = -0x78;
  local_38[6] = -8;
  local_38[7] = '?';
  local_40 = 1.53333;
  predicate_12.absolute = 2.2250738585072014e-308;
  predicate_12.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.53333","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x56,0x10e1e1,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_12);
  local_38[0] = -99;
  local_38[1] = -0x68;
  local_38[2] = 'K';
  local_38[3] = -100;
  local_38[4] = -0x21;
  local_38[5] = 'L';
  local_38[6] = -9;
  local_38[7] = '?';
  local_40 = 1.45627;
  predicate_13.absolute = 2.2250738585072014e-308;
  predicate_13.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.45627","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x58,0x10e1e1,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_13);
  local_38[0] = -0x77;
  local_38[1] = -0x78;
  local_38[2] = -0x78;
  local_38[3] = -0x78;
  local_38[4] = -0x78;
  local_38[5] = -0x78;
  local_38[6] = -8;
  local_38[7] = '?';
  local_40 = 1.53333;
  predicate_14.absolute = 2.2250738585072014e-308;
  predicate_14.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.53333","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x5a,0x10e1e1,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_14);
  local_38[0] = 'C';
  local_38[1] = 'N';
  local_38[2] = 'P';
  local_38[3] = -0x5e;
  local_38[4] = '\x01';
  local_38[5] = 'X';
  local_38[6] = -9;
  local_38[7] = '?';
  local_40 = 1.45899;
  predicate_15.absolute = 2.2250738585072014e-308;
  predicate_15.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.45899","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x5c,0x10e1e1,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_15);
  local_38[0] = -0x78;
  local_38[1] = -0x78;
  local_38[2] = -0x78;
  local_38[3] = -0x78;
  local_38[4] = -0x78;
  local_38[5] = -0x78;
  local_38[6] = -8;
  local_38[7] = '?';
  local_40 = 1.53333;
  predicate_16.absolute = 2.2250738585072014e-308;
  predicate_16.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.53333","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x5e,0x10e1e1,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_16);
  local_38[0] = 'x';
  local_38[1] = -0x75;
  local_38[2] = -0x80;
  local_38[3] = '`';
  local_38[4] = '\x03';
  local_38[5] = '`';
  local_38[6] = -9;
  local_38[7] = '?';
  local_40 = 1.46094;
  predicate_17.absolute = 2.2250738585072014e-308;
  predicate_17.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.46094","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x60,0x10e1e1,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_17);
  local_38[0] = -0x78;
  local_38[1] = -0x78;
  local_38[2] = -0x78;
  local_38[3] = -0x78;
  local_38[4] = -0x78;
  local_38[5] = -0x78;
  local_38[6] = -8;
  local_38[7] = '?';
  local_40 = 1.53333;
  predicate_18.absolute = 2.2250738585072014e-308;
  predicate_18.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.53333","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x62,0x10e1e1,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_18);
  local_38[0] = 'U';
  local_38[1] = -0x62;
  local_38[2] = -0x68;
  local_38[3] = '\x14';
  local_38[4] = 'b';
  local_38[5] = -0x34;
  local_38[6] = '`';
  local_38[7] = '@';
  local_40 = 134.387;
  predicate_19.absolute = 2.2250738585072014e-308;
  predicate_19.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","134.387","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x67,0x10e1e1,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_19);
  local_38[0] = '\t';
  local_38[1] = -0x1a;
  local_38[2] = '\x1c';
  local_38[3] = '?';
  local_38[4] = 'i';
  local_38[5] = ':';
  local_38[6] = ']';
  local_38[7] = '@';
  local_40 = 116.913;
  predicate_20.absolute = 2.2250738585072014e-308;
  predicate_20.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","116.913","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x6c,0x10e1e1,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_20);
  local_38[0] = -0x7e;
  local_38[1] = 'r';
  local_38[2] = -99;
  local_38[3] = -0x73;
  local_38[4] = '\x06';
  local_38[5] = 'n';
  local_38[6] = 'Y';
  local_38[7] = '@';
  local_40 = 101.719;
  predicate_21.absolute = 2.2250738585072014e-308;
  predicate_21.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","101.719","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x6e,0x10e1e1,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_21);
  local_38[0] = 'A';
  local_38[1] = '-';
  local_38[2] = 'L';
  local_38[3] = '9';
  local_38[4] = -0x76;
  local_38[5] = '.';
  local_38[6] = 'V';
  local_38[7] = '@';
  local_40 = 88.7272;
  predicate_22.absolute = 2.2250738585072014e-308;
  predicate_22.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","88.7272","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x70,0x10e1e1,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_22);
  local_38[0] = -0x2b;
  local_38[1] = -0x3b;
  local_38[2] = -0x7d;
  local_38[3] = '\x7f';
  local_38[4] = -0x1c;
  local_38[5] = 'V';
  local_38[6] = 'S';
  local_38[7] = '@';
  local_40 = 77.3577;
  predicate_23.absolute = 2.2250738585072014e-308;
  predicate_23.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","77.3577","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x72,0x10e1e1,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_23);
  local_38[0] = 'w';
  local_38[1] = -0x4a;
  local_38[2] = -0x42;
  local_38[3] = -100;
  local_38[4] = -0x4c;
  local_38[5] = -0x18;
  local_38[6] = 'P';
  local_38[7] = '@';
  local_40 = 67.636;
  predicate_24.absolute = 2.2250738585072014e-308;
  predicate_24.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","67.636","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x74,0x10e1e1,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_24);
  return;
}

Assistant:

void test_alternating()
{
    const auto tolerance = detail::close_to<double>(1e-5);
    decay::moment<double> filter(one_over_eight);

    // Convergence towards 1.5

    filter.push(1.0);
    TRIAL_TEST_WITH(filter.mean(), 1.0, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.mean(), 1.53333, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.mean(), 1.33136, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.mean(), 1.53333, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.mean(), 1.39647, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.mean(), 1.53333, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.mean(), 1.42356, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.mean(), 1.53333, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.mean(), 1.43801, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.mean(), 1.53333, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.mean(), 1.44673, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.mean(), 1.53333, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.mean(), 1.4524, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.mean(), 1.53333, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.mean(), 1.45627, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.mean(), 1.53333, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.mean(), 1.45899, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.mean(), 1.53333, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.mean(), 1.46094, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.mean(), 1.53333, tolerance);

    // Outlier

    filter.push(1000.0);
    TRIAL_TEST_WITH(filter.mean(), 134.387, tolerance);

    // Slow recovery

    filter.push(2.0);
    TRIAL_TEST_WITH(filter.mean(), 116.913, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.mean(), 101.719, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.mean(), 88.7272, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.mean(), 77.3577, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.mean(), 67.636, tolerance);
}